

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_asn1.cc
# Opt level: O0

int i2d_DHparams(DH *a,uchar **pp)

{
  int iVar1;
  undefined1 local_50 [8];
  CBB cbb;
  uint8_t **outp_local;
  DH *in_local;
  
  cbb.u._24_8_ = pp;
  iVar1 = CBB_init((CBB *)local_50,0);
  if ((iVar1 != 0) && (iVar1 = DH_marshal_parameters((CBB *)local_50,(DH *)a), iVar1 != 0)) {
    iVar1 = CBB_finish_i2d((CBB *)local_50,(uint8_t **)cbb.u._24_8_);
    return iVar1;
  }
  CBB_cleanup((CBB *)local_50);
  return -1;
}

Assistant:

int i2d_DHparams(const DH *in, uint8_t **outp) {
  CBB cbb;
  if (!CBB_init(&cbb, 0) ||
      !DH_marshal_parameters(&cbb, in)) {
    CBB_cleanup(&cbb);
    return -1;
  }
  return CBB_finish_i2d(&cbb, outp);
}